

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

iterator __thiscall
ImVector<ImGuiStorage::Pair>::insert
          (ImVector<ImGuiStorage::Pair> *this,const_iterator it,value_type *v)

{
  int iVar1;
  int new_capacity;
  anon_union_8_3_a9ee5d6f_for_Pair_1 aVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  const_iterator pvVar7;
  
  pvVar7 = this->Data;
  if (pvVar7 <= it) {
    iVar1 = this->Size;
    lVar4 = (long)iVar1;
    if (it <= pvVar7 + lVar4) {
      lVar6 = (long)it - (long)pvVar7;
      if (iVar1 == this->Capacity) {
        if (iVar1 == 0) {
          iVar3 = 8;
        }
        else {
          iVar3 = iVar1 / 2 + iVar1;
        }
        new_capacity = iVar1 + 1;
        if (iVar1 + 1 < iVar3) {
          new_capacity = iVar3;
        }
        reserve(this,new_capacity);
        lVar4 = (long)this->Size;
        pvVar7 = this->Data;
      }
      lVar5 = lVar4 - (lVar6 >> 4);
      if (lVar5 != 0 && lVar6 >> 4 <= lVar4) {
        memmove((void *)((long)pvVar7 + lVar6 + 0x10),(void *)((long)pvVar7 + lVar6),lVar5 * 0x10);
        pvVar7 = this->Data;
      }
      aVar2 = v->field_1;
      *(undefined8 *)((long)pvVar7 + lVar6) = *(undefined8 *)v;
      *(anon_union_8_3_a9ee5d6f_for_Pair_1 *)((undefined8 *)((long)pvVar7 + lVar6) + 1) = aVar2;
      this->Size = this->Size + 1;
      return (iterator)(lVar6 + (long)this->Data);
    }
  }
  __assert_fail("it >= Data && it <= Data+Size",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                ,0x4e6,
                "iterator ImVector<ImGuiStorage::Pair>::insert(const_iterator, const value_type &) [T = ImGuiStorage::Pair]"
               );
}

Assistant:

inline iterator     insert(const_iterator it, const value_type& v)  { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(value_type)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }